

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

QSslConfiguration __thiscall QSslSocket::sslConfiguration(QSslSocket *this)

{
  long lVar1;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var2;
  long *plVar3;
  SslProtocol SVar4;
  QSslConfigurationPrivate *this_00;
  long in_RSI;
  long in_FS_OFFSET;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 8);
  this_00 = (QSslConfigurationPrivate *)operator_new(0x140);
  QSslConfigurationPrivate::QSslConfigurationPrivate
            (this_00,(QSslConfigurationPrivate *)(lVar1 + 0x298));
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  QSslSocketPrivate::sessionCipher((QSslSocketPrivate *)&local_30);
  _Var2._M_head_impl =
       (this_00->sessionCipher).d._M_t.
       super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
       super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
  (this_00->sessionCipher).d._M_t.
  super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = _Var2._M_head_impl;
  QSslCipher::~QSslCipher((QSslCipher *)&local_30);
  plVar3 = *(long **)(lVar1 + 0x408);
  if (plVar3 == (long *)0x0) {
    SVar4 = UnknownProtocol;
  }
  else {
    SVar4 = (**(code **)(*plVar3 + 0xc0))();
  }
  this_00->sessionProtocol = SVar4;
  *(QSslConfigurationPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QSslConfiguration QSslSocket::sslConfiguration() const
{
    Q_D(const QSslSocket);

    // create a deep copy of our configuration
    QSslConfigurationPrivate *copy = new QSslConfigurationPrivate(d->configuration);
    copy->ref.storeRelaxed(0);              // the QSslConfiguration constructor refs up
    copy->sessionCipher = d->sessionCipher();
    copy->sessionProtocol = d->sessionProtocol();

    return QSslConfiguration(copy);
}